

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::anon_unknown_77::AsyncPipe::BlockedRead::shutdownWrite(BlockedRead *this)

{
  PromiseFulfiller<unsigned_long> *pPVar1;
  unsigned_long local_28;
  ArrayPtr<const_char> local_20;
  BlockedRead *local_10;
  BlockedRead *this_local;
  
  local_10 = this;
  StringPtr::StringPtr((StringPtr *)&local_20,"shutdownWrite() was called");
  Canceler::cancel(&this->canceler,(StringPtr)local_20);
  pPVar1 = this->fulfiller;
  local_28 = cp<unsigned_long>(&this->readSoFar);
  (**pPVar1->_vptr_PromiseFulfiller)(pPVar1,&local_28);
  endState(this->pipe,&this->super_AsyncIoStream);
  AsyncPipe::shutdownWrite(this->pipe);
  return;
}

Assistant:

void shutdownWrite() override {
      canceler.cancel("shutdownWrite() was called");
      fulfiller.fulfill(kj::cp(readSoFar));
      pipe.endState(*this);
      pipe.shutdownWrite();
    }